

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O0

void __thiscall
KDIS::NETWORK::Connection::SetSendAddress(Connection *this,KString *A,KBOOL Multicast)

{
  uint16_t uVar1;
  in_addr_t iVar2;
  char *__cp;
  KException *this_00;
  int *piVar3;
  KCHAR8 *__s;
  allocator<char> local_49;
  KString local_48;
  int local_24;
  undefined4 local_20;
  KINT32 iRet;
  KINT32 yes;
  KBOOL Multicast_local;
  KString *A_local;
  Connection *this_local;
  
  iRet._3_1_ = Multicast;
  _yes = A;
  A_local = (KString *)this;
  std::__cxx11::string::operator=((string *)&this->m_sSendAddress,(string *)A);
  memset(&this->m_SendToAddr,0,0x10);
  (this->m_SendToAddr).sin_family = 2;
  __cp = (char *)std::__cxx11::string::c_str();
  iVar2 = inet_addr(__cp);
  (this->m_SendToAddr).sin_addr.s_addr = iVar2;
  uVar1 = htons((uint16_t)this->m_uiPort);
  (this->m_SendToAddr).sin_port = uVar1;
  if ((iRet._3_1_ & 1) == 0) {
    local_20 = 1;
    local_24 = setsockopt(this->m_iSocket[0],1,6,&local_20,4);
    if (local_24 == -1) {
      this_00 = (KException *)__cxa_allocate_exception(0x30);
      piVar3 = __errno_location();
      __s = getErrorText(this,*piVar3);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,__s,&local_49);
      KException::KException(this_00,&local_48,0xc);
      __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
    }
  }
  else {
    (*this->_vptr_Connection[4])(this,_yes);
  }
  return;
}

Assistant:

void Connection::SetSendAddress(const KString &A, KBOOL Multicast /*= false */ ) noexcept(false)
{
    m_sSendAddress = A;

    // Create the send to address structure
    memset( &m_SendToAddr, 0, sizeof( m_SendToAddr ) );
    m_SendToAddr.sin_family = AF_INET;
    m_SendToAddr.sin_addr.s_addr = inet_addr( m_sSendAddress.c_str() );
    m_SendToAddr.sin_port = htons( m_uiPort );

    if( Multicast )
    {
        AddMulticastAddress( A );

        // TODO: Do we need to disable broadcasting on the socket if we switch to multicast?
    }
    else
    {
        // Enable broadcasting on the send socket
        KINT32 yes = 1;
        KINT32 iRet = setsockopt( m_iSocket[SEND_SOCK], SOL_SOCKET, SO_BROADCAST, ( const char * )&yes, sizeof( yes ) );
        if( iRet == SOCKET_ERROR )
        {
            THROW_ERROR;
        }
    }
}